

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O2

Ssw_RarMan_t * Ssw_RarManStart(Aig_Man_t *pAig,Ssw_RarPars_t *pPars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Ssw_RarMan_t *pSVar4;
  int *piVar5;
  double *pdVar6;
  word *pwVar7;
  Vec_Ptr_t *pVVar8;
  Vec_Int_t *pVVar9;
  size_t __nmemb;
  
  pSVar4 = (Ssw_RarMan_t *)calloc(1,0x70);
  pSVar4->pAig = pAig;
  pSVar4->pPars = pPars;
  uVar1 = pAig->nRegs;
  iVar2 = pPars->nBinSize;
  iVar3 = (int)uVar1 / iVar2;
  pSVar4->nGroups = iVar3;
  piVar5 = (int *)calloc((long)(iVar3 << ((byte)iVar2 & 0x1f)),4);
  pSVar4->pRarity = piVar5;
  iVar2 = pPars->nWords;
  __nmemb = (long)iVar2 << 6;
  pdVar6 = (double *)calloc(__nmemb,8);
  pSVar4->pPatCosts = pdVar6;
  iVar3 = (((int)uVar1 >> 6) + 1) - (uint)((uVar1 & 0x3f) == 0);
  pSVar4->nWordsReg = iVar3;
  pwVar7 = (word *)malloc((long)pAig->vObjs->nSize * (long)iVar2 * 8);
  pSVar4->pObjData = pwVar7;
  pwVar7 = (word *)malloc((long)(iVar3 * (int)__nmemb) << 3);
  pSVar4->pPatData = pwVar7;
  pVVar8 = Vec_PtrAlloc(100);
  pSVar4->vUpdConst = pVVar8;
  pVVar8 = Vec_PtrAlloc(100);
  pSVar4->vUpdClass = pVVar8;
  pVVar9 = Vec_IntAlloc(100);
  pSVar4->vPatBests = pVVar9;
  return pSVar4;
}

Assistant:

static Ssw_RarMan_t * Ssw_RarManStart( Aig_Man_t * pAig, Ssw_RarPars_t * pPars )
{
    Ssw_RarMan_t * p;
//    if ( Aig_ManRegNum(pAig) < nBinSize || nBinSize <= 0 )
//        return NULL;
    p = ABC_CALLOC( Ssw_RarMan_t, 1 );
    p->pAig      = pAig;
    p->pPars     = pPars;
    p->nGroups   = Aig_ManRegNum(pAig) / pPars->nBinSize;
    p->pRarity   = ABC_CALLOC( int, (1 << pPars->nBinSize) * p->nGroups );
    p->pPatCosts = ABC_CALLOC( double, p->pPars->nWords * 64 );
    p->nWordsReg = Ssw_RarBitWordNum( Aig_ManRegNum(pAig) );
    p->pObjData  = ABC_ALLOC( word, Aig_ManObjNumMax(pAig) * p->pPars->nWords );
    p->pPatData  = ABC_ALLOC( word, 64 * p->pPars->nWords * p->nWordsReg );
    p->vUpdConst = Vec_PtrAlloc( 100 );
    p->vUpdClass = Vec_PtrAlloc( 100 );
    p->vPatBests = Vec_IntAlloc( 100 );
    return p;
}